

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

Address * readArguments(Address *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  
  if (2 < argc) {
    strcpy(__return_storage_ptr__->ip,argv[1]);
    iVar1 = atoi(argv[2]);
    __return_storage_ptr__->port = iVar1;
    return __return_storage_ptr__;
  }
  puts("\x1b[31mWrong number of parameters!\x1b[0m");
  printf("Usage: %s <ip> <port>\n",*argv);
  exit(-1);
}

Assistant:

Address
readArguments(int argc, char** argv)
{
    Address addr;

    if (argc < 3) {
        printf("\x1b[31mWrong number of parameters!\x1b[0m\n");
        printf("Usage: %s <ip> <port>\n", argv[0]);
        exit(-1);
    }

    #if 0 
        addr.ip = argv[1];
    #else
        strcpy(addr.ip, argv[1]);
    #endif
    addr.port = atoi(argv[2]);

    return addr;
}